

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O1

void __thiscall
lzham::lzcompressor::lzcompressor(lzcompressor *this,lzham_malloc_context malloc_context)

{
  uint8 *puVar1;
  int iVar2;
  long lVar3;
  
  this->m_malloc_context = malloc_context;
  (this->m_params).m_pTask_pool = (task_pool *)0x0;
  (this->m_params).m_max_helper_threads = 0;
  (this->m_params).m_compression_level = cCompressionLevelDefault;
  (this->m_params).m_dict_size_log2 = 0x16;
  (this->m_params).m_block_size = 0x80000;
  (this->m_params).m_lzham_compress_flags = 0;
  (this->m_params).m_pSeed_bytes = (void *)0x0;
  (this->m_params).m_num_seed_bytes = 0;
  (this->m_params).m_table_max_update_interval = 0;
  (this->m_params).m_table_update_interval_slow_rate = 0;
  (this->m_params).m_extreme_parsing_max_best_arrivals = 4;
  (this->m_params).m_fast_bytes_override = 0;
  this->m_src_size = -1;
  this->m_src_adler32 = 0;
  search_accelerator::search_accelerator(&this->m_accel,malloc_context);
  lzham::symbol_codec::symbol_codec(&this->m_codec,malloc_context);
  coding_stats::coding_stats(&this->m_stats);
  (this->m_block_buf).m_p = (uchar *)0x0;
  (this->m_block_buf).m_size = 0;
  (this->m_block_buf).m_capacity = 0;
  (this->m_block_buf).m_malloc_context = malloc_context;
  (this->m_comp_buf).m_p = (uchar *)0x0;
  (this->m_comp_buf).m_size = 0;
  (this->m_comp_buf).m_capacity = 0;
  (this->m_comp_buf).m_malloc_context = malloc_context;
  this->m_step = 0;
  this->m_block_start_dict_ofs = 0;
  *(undefined8 *)((long)&this->m_block_start_dict_ofs + 3) = 0;
  state::state(&this->m_start_of_block_state,malloc_context);
  state::state(&this->m_state,malloc_context);
  this->m_fast_bytes = 0x80;
  this->m_num_parse_threads = 0;
  lVar3 = 0;
  do {
    state::state((state *)((long)this->m_parse_thread_state[0].super_raw_parse_thread_state.m_state.
                                 super_state_base.m_match_hist + lVar3 + -8),
                 (lzham_malloc_context)0x0);
    puVar1 = this->m_parse_thread_state[0].m_unused_alignment_array + lVar3 + -0x70;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '\0';
    puVar1[5] = '\0';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
    puVar1 = this->m_parse_thread_state[0].m_unused_alignment_array + lVar3 + -0x68;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '\0';
    puVar1[5] = '\0';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
    puVar1 = this->m_parse_thread_state[0].m_unused_alignment_array + lVar3 + -0x60;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '\0';
    puVar1[5] = '\0';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
    puVar1 = this->m_parse_thread_state[0].m_unused_alignment_array + lVar3 + -0x50;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '\0';
    puVar1[5] = '\0';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
    puVar1 = this->m_parse_thread_state[0].m_unused_alignment_array + lVar3 + -0x48;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '\0';
    puVar1[5] = '\0';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
    puVar1 = this->m_parse_thread_state[0].m_unused_alignment_array + lVar3 + -0x40;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '\0';
    puVar1[5] = '\0';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
    iVar2 = sem_init((sem_t *)(this->m_parse_thread_state[0].m_unused_alignment_array +
                              lVar3 + -0x20),0,0);
    if (iVar2 != 0) {
      lzham_fail("\"semaphore: sem_init() failed\"",
                 "/workspace/llm4binary/github/license_c_cmakelists/richgel999[P]lzham_codec_devel/lzhamcomp/lzham_pthreads_threading.h"
                 ,0x80);
    }
    lVar3 = lVar3 + 0x156800;
  } while (lVar3 != 0xc0a800);
  lVar3 = 0x43f0;
  do {
    raw_parse_thread_state::set_malloc_context
              ((raw_parse_thread_state *)
               ((long)&(this->super_CLZBase).super_CLZDecompBase.m_dict_size_log2 + lVar3),
               malloc_context);
    lVar3 = lVar3 + 0x156800;
  } while (lVar3 != 0xc0ebf0);
  return;
}

Assistant:

lzcompressor::lzcompressor(lzham_malloc_context malloc_context) :
      m_malloc_context(malloc_context),
      m_src_size(-1),
      m_src_adler32(0),
      m_accel(malloc_context),
      m_codec(malloc_context),
      m_block_buf(malloc_context),
      m_comp_buf(malloc_context),
      m_step(0),
      m_block_start_dict_ofs(0),
      m_block_index(0),
      m_finished(false),
      m_use_task_pool(false),
      m_use_extreme_parsing(false),
      m_start_of_block_state(malloc_context),
      m_state(malloc_context),
      m_fast_bytes(128),
      m_num_parse_threads(0)
   {
      LZHAM_VERIFY( ((uint32_ptr)this & (LZHAM_GET_ALIGNMENT(lzcompressor) - 1)) == 0);

      for (uint i = 0; i < LZHAM_ARRAY_SIZE(m_parse_thread_state); i++)
         m_parse_thread_state[i].set_malloc_context(malloc_context);
   }